

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_base32.cpp
# Opt level: O0

void __thiscall
Base32_UInt128High64Array_Test::Base32_UInt128High64Array_Test(Base32_UInt128High64Array_Test *this)

{
  Base32_UInt128High64Array_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Base32_UInt128High64Array_Test_003cc738;
  return;
}

Assistant:

TEST (Base32, UInt128High64Array) {
    using pstore::uint128;
    using pstore::base32::convert;
    uint128 v{std::array<std::uint8_t, 16>{{
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0xff,
        0x00,
        0x00,
        0x00,
        0x00,
        0x00,
        0x00,
        0x00,
        0x00,
    }}};
    EXPECT_EQ (convert (v), "aaaaaaaaaaaaq777777777777h");
}